

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

ssize_t __thiscall
TadsServerThread::read(TadsServerThread *this,int __fd,void *__buf,size_t __nbytes)

{
  OS_Event *pOVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ssize_t sVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined4 in_register_00000084;
  bool bVar7;
  OS_Waitable *w [3];
  int ok;
  size_t dstlen;
  char *dst;
  char ibuf [4096];
  int len;
  long totlen;
  unsigned_long t_end;
  unsigned_long t;
  OS_Waitable *local_10c8;
  OS_Event *in_stack_ffffffffffffef48;
  TadsServerThread *in_stack_ffffffffffffef50;
  void *local_1098;
  void *local_1068;
  int local_1060;
  undefined1 local_1058 [88];
  unsigned_long in_stack_fffffffffffff000;
  OS_Waitable **in_stack_fffffffffffff008;
  int in_stack_fffffffffffff014;
  long local_48;
  long local_30;
  void *local_28;
  
  local_30 = CONCAT44(in_register_00000084,in_R8D);
  local_10c8 = (OS_Waitable *)__nbytes;
  lVar3 = os_get_sys_clock_ms();
  uVar4 = lVar3 + local_30;
  local_48 = 0;
  local_28 = (void *)__nbytes;
  if ((CONCAT44(in_register_00000034,__fd) != 0) && ((long)__buf < (long)__nbytes)) {
    local_28 = __buf;
  }
  while( true ) {
    while( true ) {
      if (CONCAT44(in_register_00000034,__fd) == 0) {
        local_1060 = (int)local_1058;
        if (local_28 < (void *)0x1000) {
          local_1098 = local_28;
        }
        else {
          local_1098 = (void *)0x1000;
        }
        local_1068 = local_1098;
      }
      else {
        local_1060 = __fd + (int)local_48;
        local_1068 = (void *)((long)__buf - local_48);
      }
      set_run_state(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
      sVar5 = OS_Socket::recv(this->socket,local_1060,local_1068,(size_t)local_10c8,in_R8D);
      iVar2 = (int)sVar5;
      if (iVar2 != -1) break;
      bVar7 = false;
      iVar2 = OS_CoreSocket::last_error(&this->socket->super_OS_CoreSocket);
      if (iVar2 == 0xb) {
        if (local_30 != -1) {
          uVar6 = os_get_sys_clock_ms();
          if (uVar4 < uVar6) {
            return -1;
          }
          local_30 = uVar4 - uVar6;
        }
        set_run_state(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
        in_stack_ffffffffffffef48 = this->listener->quit_evt;
        in_stack_ffffffffffffef50 = (TadsServerThread *)0x0;
        if (in_stack_ffffffffffffef48 != (OS_Event *)0x0) {
          in_stack_ffffffffffffef50 =
               (TadsServerThread *)&in_stack_ffffffffffffef48->super_OS_Waitable;
        }
        pOVar1 = this->listener->shutdown_evt;
        local_10c8 = (OS_Waitable *)0x0;
        if (pOVar1 != (OS_Event *)0x0) {
          local_10c8 = &pOVar1->super_OS_Waitable;
        }
        iVar2 = OS_Waitable::multi_wait
                          (in_stack_fffffffffffff014,in_stack_fffffffffffff008,
                           in_stack_fffffffffffff000);
        bVar7 = iVar2 == 0;
        if (bVar7) {
          OS_CoreSocket::reset_event(&this->socket->super_OS_CoreSocket);
        }
      }
      if (!bVar7) {
        return -1;
      }
    }
    if (iVar2 == 0) {
      set_run_state(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
      return -1;
    }
    if ((long)local_28 <= (long)iVar2) break;
    local_48 = iVar2 + local_48;
    local_10c8 = (OS_Waitable *)(long)iVar2;
    local_28 = (void *)((long)local_28 - (long)local_10c8);
  }
  set_run_state(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
  return local_48 + iVar2;
}

Assistant:

long TadsServerThread::read(char *buf, size_t buflen, long minlen,
                            unsigned long timeout)
{
    /* figure the ending time for the wait */
    unsigned long t = os_get_sys_clock_ms(), t_end = t + timeout;

    /* we haven't read any bytes yet */
    long totlen = 0;

    /* if the caller provided a buffer, we can't read past the buffer */
    if (buf != 0 && minlen > (long)buflen)
        minlen = buflen;
    
    /* keep going until we read some data */
    for (;;)
    {
        int len;
        char ibuf[4096], *dst;
        size_t dstlen;

        /* figure the buffer destination and size to read on this round */
        if (buf == 0)
        {
            /* 
             *   There's no buffer, so read into our internal buffer.  Tead
             *   up to the remaining minimum size, or to our available
             *   internal space, whichever is less.  
             */
            dst = ibuf;
            dstlen = (minlen < sizeof(ibuf) ? minlen : sizeof(ibuf));
        }
        else
        {
            /* 
             *   Read into the caller's buffer, after any data we've read so
             *   far, up to the remaining buffer length. 
             */
            dst = buf + totlen;
            dstlen = buflen - totlen;
        }

        /* read the data */
        set_run_state("Receiving");
        len = socket->recv(dst, dstlen);

        /* if an error occurred, check what happened */
        if (len == OS_SOCKET_ERROR)
        {
            /* presume failure */
            int ok = FALSE;
            
            /* if this is a would-block error, wait for data to arrive */
            if (socket->last_error() == OS_EWOULDBLOCK)
            {
                /* 
                 *   No data available - wait until we receive at least one
                 *   byte, or until the 'quit' event is signaled or a timeout
                 *   occurs.  Figure the next timeout expiration, if we have
                 *   a timeout at all.  
                 */
                if (timeout != OS_FOREVER)
                {
                    /* if we're already past the timeout expiration, fail */
                    t = os_get_sys_clock_ms();
                    if (t > t_end)
                        return -1;

                    /* figure the remaining timeout interval */
                    timeout = t_end - t;
                }

                /* wait */
                set_run_state("Waiting(receive)");
                OS_Waitable *w[] = {
                    socket, listener->quit_evt, listener->shutdown_evt
                };
                if (OS_Waitable::multi_wait(3, w, timeout) == OSWAIT_EVENT + 0)
                {
                    /* the socket is now ready - reset it and keep going */
                    socket->reset_event();
                    ok = TRUE;
                }
            }

            /* if we didn't correct the error, give up */
            if (!ok)
                return -1;
        }
        else if (len == 0)
        {
            /* the socket has been closed - return failure */
            set_run_state("Error(receiving)");
            return -1;
        }
        else if (len >= minlen)
        {
            /* we've satisfied the request - return the bytes */
            set_run_state("Receive completed");
            return totlen + len;
        }
        else
        {
            /* 
             *   We've read some data, but not enough to satisfy the minimum
             *   length request.  Add the current chunk to the total read so
             *   far, and deduct it from the remaining minimum.  
             */
            totlen += len;
            minlen -= len;
        }
    }
}